

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void BailOutRecord::ScheduleFunctionCodeGen
               (ScriptFunction *function,ScriptFunction *innerMostInlinee,
               BailOutRecord *bailOutRecord,BailOutKind bailOutKind,uint32 actualBailOutOffset,
               ImplicitCallFlags savedImplicitCallFlags,void *returnAddress)

{
  undefined1 *puVar1;
  uint *puVar2;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  FunctionEntryPointInfo *pFVar4;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  code *pcVar5;
  ulong uVar6;
  bool bVar7;
  ExecutionMode EVar8;
  ImplicitCallFlags IVar9;
  BYTE BVar10;
  byte bVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  LocalFunctionId functionId;
  uint32 uVar16;
  FunctionBody *pFVar17;
  undefined4 *puVar18;
  FunctionEntryPointInfo *pFVar19;
  long lVar20;
  RecyclableData *pRVar21;
  Type *pTVar22;
  ScriptContext *pSVar23;
  undefined4 extraout_var_01;
  char *pcVar24;
  char *pcVar25;
  JavascriptMethod entryPoint;
  FunctionInfo *pFVar26;
  undefined4 extraout_var_02;
  char16 *pcVar27;
  undefined7 uVar29;
  undefined7 extraout_var;
  DynamicProfileInfo *pDVar28;
  undefined7 extraout_var_00;
  undefined4 in_register_0000000c;
  long lVar30;
  char16_t *pcVar31;
  RejitReason reason;
  BailOutRecord *this_00;
  char cVar32;
  RejitReason RVar33;
  BailOutKind bailOutKind_00;
  BailOutKind local_d8 [2];
  char16 debugStringBuffer [42];
  BailOutKind local_74;
  Type local_70;
  uint local_6c;
  ScriptFunction *local_68;
  BailOutRecord *local_60;
  ulong local_58;
  byte local_49;
  FunctionBody *local_48;
  DynamicProfileInfo *local_40;
  undefined4 local_34;
  
  local_58 = CONCAT44(in_register_0000000c,bailOutKind);
  if (bailOutKind == BailOnSimpleJitToFullJitLoopBody) {
    return;
  }
  if (bailOutKind == BailOutForGeneratorYield) {
    return;
  }
  local_70 = actualBailOutOffset;
  local_68 = function;
  pFVar17 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar17);
  pFVar26 = (pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  local_60 = bailOutRecord;
  local_48 = pFVar17;
  if (pFVar26 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_003fcf16;
    *puVar18 = 0;
    pFVar26 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  this_00 = local_60;
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,ReJITPhase,uVar13,pFVar26->functionId);
  pFVar17 = local_48;
  if (bVar7) {
    return;
  }
  register0x00000000 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_48);
  register0x00000000->firstInterpreterFrameReturnAddress = returnAddress;
  this_00->bailOutCount = this_00->bailOutCount + 1;
  pFVar19 = GetFunctionEntryPointInfo(this_00);
  uVar6 = local_58;
  pSVar3 = (pFVar17->entryPoints).ptr;
  bailOutKind_00 = (BailOutKind)local_58;
  if ((pSVar3 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  *)0x0) &&
     (lVar20 = (long)(pSVar3->
                     super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ).
                     super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                     .count, 0 < lVar20)) {
    lVar30 = 0;
    do {
      pFVar4 = (FunctionEntryPointInfo *)
               (((pSVar3->
                 super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ).
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 .buffer.ptr[lVar30].ptr)->super_RecyclerWeakReferenceBase).strongRef;
      if (pFVar4 != (FunctionEntryPointInfo *)0x0 && pFVar19 == pFVar4) goto LAB_003fc27e;
      lVar30 = lVar30 + 1;
    } while (lVar20 != lVar30);
  }
  pRVar21 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                      (&((((((local_68->super_ScriptFunctionBase).super_JavascriptFunction.
                             super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary
                           ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext->
                        recyclableData);
  pTVar22 = &pRVar21->oldEntryPointInfo;
  do {
    pFVar4 = pTVar22->ptr;
    if (pFVar4 == pFVar19) break;
    pTVar22 = &pFVar4->nextEntryPoint;
  } while (pFVar4 != (FunctionEntryPointInfo *)0x0);
  this_00 = local_60;
  if (pFVar4 == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x752,"(foundEntryPoint)","foundEntryPoint");
    if (!bVar7) goto LAB_003fcf16;
    *puVar18 = 0;
    this_00 = local_60;
  }
LAB_003fc27e:
  uVar15 = 0xff;
  if (pFVar19->callsCount < 0xff) {
    uVar15 = pFVar19->callsCount;
  }
  local_49 = (byte)uVar15 - ((char)DAT_015b094c + 1U);
  if ((byte)uVar15 < (byte)((char)DAT_015b094c + 1U)) {
    local_49 = 0;
  }
  CheckPreemptiveRejit(local_48,bailOutKind_00,this_00,&local_49,-1);
  local_6c = (uint)local_49;
  pFVar19->callsCount = local_6c;
  if (bailOutKind_00 == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x75f,"(bailOutKind != IR::BailOutInvalid)",
                       "bailOutKind != IR::BailOutInvalid");
    if (!bVar7) goto LAB_003fcf16;
    *puVar18 = 0;
  }
  if ((local_48->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    local_40 = (DynamicProfileInfo *)0x0;
LAB_003fc360:
    uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_48);
    pFVar26 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar26 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar18 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) goto LAB_003fcf16;
      *puVar18 = 0;
      pFVar26 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,ReJITPhase,uVar13,pFVar26->functionId);
    if (bVar7) goto LAB_003fc3f7;
    local_34 = 0;
LAB_003fc458:
    RVar33 = None;
  }
  else {
    local_40 = Js::FunctionBody::GetAnyDynamicProfileInfo(local_48);
    if (local_40 == (DynamicProfileInfo *)0x0 || (char)local_6c != '\0') goto LAB_003fc360;
LAB_003fc3f7:
    if (((uVar6 & 0x30003c00) == 0) &&
       ((BailOnDivResultNotInt < bailOutKind_00 ||
        ((0xc0000002U >> (bailOutKind_00 & BailOnDivResultNotInt) & 1) == 0)))) {
      if ((uVar6 & 0xfe00000) != 0) {
        local_34 = 0;
switchD_003fc99e_caseD_c:
        RVar33 = None;
        goto LAB_003fc49e;
      }
      local_34 = 0;
      uVar29 = (undefined7)((ulong)local_40 >> 8);
      if ((int)bailOutKind_00 < 0x2000) {
        pDVar28 = local_40;
        switch(bailOutKind_00) {
        case BailOutNumberOnly:
        case BailOutPrimitiveButString:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 9 & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x200;
          RVar33 = FloatTypeSpecDisabled;
          break;
        case BailOutOnImplicitCalls:
        case BailOutOnImplicitCallsPreOp:
          IVar9 = Js::FunctionBody::GetSavedImplicitCallsFlags(local_48);
          if ((IVar9 & savedImplicitCallFlags) != ImplicitCall_None) {
            local_34 = (undefined4)CONCAT71(extraout_var,1);
            goto LAB_003fc458;
          }
          Js::DynamicProfileInfo::RecordImplicitCallFlags(local_40,savedImplicitCallFlags);
          puVar1 = &(local_40->bits).field_0x4;
          *puVar1 = *puVar1 | 4;
          RVar33 = ImplicitCallFlagsChanged;
          local_34 = 0;
          goto LAB_003fc49e;
        case BailOutOnNotPrimitive:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 & 0x40) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x40;
          RVar33 = LossyIntTypeSpecDisabled;
          break;
        case BailOutOnMemOpError:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((char)uVar15 < '\0') goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x80;
          RVar33 = MemOpDisabled;
          break;
        case BailOutOnInlineFunction:
        case BailOutOnPolymorphicInlineFunction:
        case BailOutFailedInlineTypeCheck:
          if (innerMostInlinee == (ScriptFunction *)0x0) {
            BVar10 = Js::FunctionBody::GetSavedInlinerVersion(local_48);
            RVar33 = InlineeChanged;
            pDVar28 = (DynamicProfileInfo *)CONCAT71(extraout_var_00,BVar10);
            if (BVar10 == local_40->currentInlinerVersion) goto LAB_003fc481;
          }
          else {
            RVar33 = InlineeChanged;
          }
          break;
        case BailOutOnNoProfile:
          if (((local_40->bits).field_0x3 & 0x20) == 0) {
            bVar11 = local_48->bailOnMisingProfileRejitCount + 1;
            local_48->bailOnMisingProfileRejitCount = bVar11;
            if (DAT_015932fc < bVar11) {
              puVar1 = &(local_40->bits).field_0x3;
              *puVar1 = *puVar1 | 0x20;
              RVar33 = NoProfile;
LAB_003fccb7:
              local_34 = 0;
            }
            else {
              local_48->bailOnMisingProfileCount = '\0';
              RVar33 = NoProfile;
              local_34 = 0;
            }
          }
          else {
            local_34 = (undefined4)CONCAT71(uVar29,1);
            RVar33 = None;
          }
LAB_003fcef6:
          bailOutKind_00 = (BailOutKind)local_58;
          goto LAB_003fc49e;
        case BailOutOnFailedPolymorphicInlineTypeCheck:
          RVar33 = FailedPolymorphicInlineeTypeCheck;
          break;
        default:
          goto switchD_003fc99e_caseD_c;
        case BailOutOnNotArray:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0xb & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x1800;
          RVar33 = ArrayCheckHoistDisabled;
          break;
        case BailOutOnNotNativeArray:
          RVar33 = ExpectingNativeArray;
          if (0x31 < local_40->rejitCount) goto LAB_003fc481;
          break;
        case BailOutConventionalTypedArrayAccessOnly:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0x13 & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x180000;
          RVar33 = TypedArrayTypeSpecDisabled;
          break;
        case BailOutOnIrregularLength:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0x15 & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x200000;
          RVar33 = LdLenIntSpecDisabled;
          break;
        case BailOutCheckThis:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 10 & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x400;
          RVar33 = CheckThisDisabled;
          break;
        case BailOutOnTaggedValue:
          bVar11 = (local_40->bits).field_0x4;
          pDVar28 = (DynamicProfileInfo *)CONCAT71(uVar29,bVar11);
          if ((bVar11 & 0x10) != 0) goto LAB_003fc481;
          (local_40->bits).field_0x4 = bVar11 | 0x10;
          RVar33 = FailedTagCheck;
          break;
        case BailOutFailedTypeCheck:
        case BailOutFailedFixedFieldTypeCheck:
          if (innerMostInlinee == (ScriptFunction *)0x0) {
            uVar15 = local_40->polymorphicCacheState;
            uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_48);
            functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_48);
            bVar7 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar13,functionId);
            if (bVar7) {
              pcVar27 = Js::FunctionProxy::GetDebugNumberSet
                                  ((FunctionProxy *)local_48,(wchar (*) [42])local_d8);
              uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState(local_48);
              Output::Print(L"Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n"
                            ,pcVar27,(ulong)uVar16,(ulong)uVar15);
              Output::Flush();
            }
            uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState(local_48);
            if (uVar15 <= uVar16) {
              RVar33 = None;
              local_34 = (undefined4)CONCAT71((uint7)(uint3)(uVar16 >> 8),1);
              goto LAB_003fcef6;
            }
            RVar33 = (BailOutKind)local_58 == BailOutFailedTypeCheck ^ FailedFixedFieldTypeCheck;
            bailOutKind_00 = (BailOutKind)local_58;
          }
          else {
            RVar33 = bailOutKind_00 == BailOutFailedTypeCheck ^ FailedFixedFieldTypeCheck;
          }
          break;
        case BailOutFailedEquivalentTypeCheck:
        case BailOutFailedEquivalentFixedFieldTypeCheck:
          if (*(int *)&local_40->bits < 0) goto LAB_003fc481;
          RVar33 = FailedEquivalentFixedFieldTypeCheck -
                   (bailOutKind_00 == BailOutFailedEquivalentTypeCheck);
          break;
        case BailOutExpectingInteger:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0x1e & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x40000000;
          RVar33 = DisableSwitchOptExpectingInteger;
          break;
        case BailOutExpectingString:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0x1e & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x40000000;
          RVar33 = DisableSwitchOptExpectingString;
          break;
        case BailOutFailedFixedFieldCheck:
          RVar33 = FailedFixedFieldCheck;
          break;
        case BailOutOnFloor:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0x1c & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x10000000;
          RVar33 = FloorInliningDisabled;
          break;
        case BailOnModByPowerOf2:
          RVar33 = ModByPowerOf2;
          break;
        case BailOutFailedCtorGuardCheck:
          RVar33 = CtorGuardInvalidated;
          break;
        case BailOutOnFailedHoistedBoundCheck:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0x16 & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0xc00000;
          RVar33 = BoundCheckHoistDisabled;
          break;
        case BailOutOnFailedHoistedLoopCountBasedBoundCheck:
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0x18 & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x3000000;
          RVar33 = LoopCountBasedBoundCheckHoistDisabled;
          break;
        case BailOutOnEarlyExit:
          bVar11 = (local_40->bits).field_0x4;
          pDVar28 = (DynamicProfileInfo *)CONCAT71(uVar29,bVar11);
          if ((bVar11 & 0x20) != 0) goto LAB_003fc481;
          (local_40->bits).field_0x4 = bVar11 | 0x20;
          RVar33 = OptimizeTryFinallyDisabled;
        }
      }
      else if ((int)bailOutKind_00 < 0x10000) {
        if (bailOutKind_00 == BailOutOnPowIntIntOverflow) {
          bVar11 = (local_40->bits).field_0x4;
          pDVar28 = (DynamicProfileInfo *)CONCAT71(uVar29,bVar11);
          if ((bVar11 & 2) != 0) goto LAB_003fc481;
          (local_40->bits).field_0x4 = bVar11 | 2;
          RVar33 = PowIntIntTypeSpecDisabled;
        }
        else if (bailOutKind_00 == BailOutOnMissingValue) {
          uVar15 = *(uint *)&local_40->bits;
          pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
          if ((uVar15 >> 0xd & 1) != 0) goto LAB_003fc481;
          *(uint *)&local_40->bits = uVar15 | 0x6000;
          RVar33 = ArrayMissingValueCheckHoistDisabled;
        }
        else {
          if (bailOutKind_00 != BailOutConventionalNativeArrayAccessOnly)
          goto switchD_003fc99e_caseD_c;
          RVar33 = ExpectingConventionalNativeArrayAccess;
        }
      }
      else if ((int)bailOutKind_00 < 0x40000) {
        if (bailOutKind_00 == BailOutConvertedNativeArray) {
          RVar33 = ConvertedNativeArray;
        }
        else {
          if (bailOutKind_00 != BailOutOnArrayAccessHelperCall) goto switchD_003fc99e_caseD_c;
          RVar33 = ArrayAccessNeededHelperCall;
        }
      }
      else {
        if (bailOutKind_00 != BailOutOnInvalidatedArrayHeadSegment) {
          if (bailOutKind_00 == BailOnStackArgsOutOfActualsRange) {
            bVar11 = (local_40->bits).field_0x4;
            if ((bVar11 & 8) == 0) {
              (local_40->bits).field_0x4 = bVar11 | 8;
              RVar33 = DisableStackArgOpt;
              goto LAB_003fccb7;
            }
            local_34 = (undefined4)CONCAT71(uVar29,1);
          }
          RVar33 = None;
          goto LAB_003fcef6;
        }
        uVar15 = *(uint *)&local_40->bits;
        pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
        if ((short)uVar15 < 0) goto LAB_003fc481;
        *(uint *)&local_40->bits = uVar15 | 0x18000;
        RVar33 = JsArraySegmentHoistDisabled;
      }
    }
    else if ((bailOutKind_00 >> 0xb & 1) == 0) {
      uVar15 = *(uint *)&local_40->bits;
      pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
      if (bailOutKind_00 == BailOnDivResultNotInt || (uVar6 & 0x30000000) != 0) {
        if ((uVar15 & 0x10) != 0) {
LAB_003fc481:
          local_34 = (undefined4)CONCAT71((int7)((ulong)pDVar28 >> 8),1);
          goto switchD_003fc99e_caseD_c;
        }
        *(uint *)&local_40->bits = uVar15 | 0x30;
        RVar33 = DivIntTypeSpecDisabled;
      }
      else {
        if ((uVar15 & 1) != 0) goto LAB_003fc481;
        *(uint *)&local_40->bits = uVar15 | 3;
        RVar33 = AggressiveIntTypeSpecDisabled;
      }
    }
    else {
      uVar15 = *(uint *)&local_40->bits;
      pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
      if ((uVar15 & 4) != 0) goto LAB_003fc481;
      *(uint *)&local_40->bits = uVar15 | 0xc;
      RVar33 = AggressiveMulIntTypeSpecDisabled;
    }
    local_34 = 0;
  }
LAB_003fc49e:
  uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_48);
  pFVar26 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar26 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_003fcf16;
    *puVar18 = 0;
    pFVar26 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,ReJITPhase,uVar13,pFVar26->functionId);
  reason = Forced;
  if (!bVar7) {
    reason = RVar33;
  }
  if (RVar33 != None) {
    reason = RVar33;
  }
  if (reason != None && (char)local_34 == '\0') {
    uVar12 = local_40->rejitCount;
    if (uVar12 < 100) {
      if (local_40->bailOutOffsetForLastRejit == local_70) {
        bVar7 = Js::ScriptFunction::IsNewEntryPointAvailable(local_68);
        if (bVar7) goto LAB_003fc55c;
        uVar12 = local_40->rejitCount;
      }
      local_40->rejitCount = uVar12 + 1;
      local_40->bailOutOffsetForLastRejit = local_70;
    }
    else {
LAB_003fc55c:
      pDVar28 = local_40;
      pSVar23 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_48);
      local_34 = (undefined4)CONCAT71((int7)((ulong)pDVar28 >> 8),1);
      if (pSVar23->rejitReasonCountsCap != (uint *)0x0) {
        puVar2 = pSVar23->rejitReasonCountsCap + reason;
        *puVar2 = *puVar2 + 1;
      }
      reason = None;
    }
  }
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,ReJITPhase);
  if ((bVar7) &&
     ((DAT_015bf3c0 == DAT_015bf3c8 ||
      (bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf3a0,bailOutKind_00), bVar7)))) {
    pFVar17 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_68);
    iVar14 = (*(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar17);
    pcVar24 = GetBailOutKindName(bailOutKind_00);
    uVar12 = local_60->bailOutCount;
    pcVar25 = GetRejitReasonName(reason);
    pcVar31 = L"false";
    if ((char)local_34 != '\0') {
      pcVar31 = L"true";
    }
    Output::Print(L"Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"
                  ,CONCAT44(extraout_var_01,iVar14),pcVar24,(ulong)uVar12,(ulong)local_6c,pcVar25,
                  pcVar31);
    Output::Flush();
  }
  pSVar23 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_48);
  Js::ScriptContext::LogBailout(pSVar23,local_48,bailOutKind_00);
  pFVar17 = local_48;
  cVar32 = (char)local_34;
  if (500 < local_60->bailOutCount) {
    pSVar23 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_48);
    this = pSVar23->bailoutReasonCountsCap;
    if (this != (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
      local_d8[0] = bailOutKind_00;
      bVar7 = JsUtil::
              BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this,local_d8);
      if (bVar7) {
        local_74 = bailOutKind_00;
        uVar15 = JsUtil::
                 BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::Item(this,&local_74);
        local_d8[0] = uVar15 + BailOutIntOnly;
        local_74 = bailOutKind_00;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this,&local_74,local_d8);
      }
      else {
        local_74 = BailOutIntOnly;
        local_d8[0] = bailOutKind_00;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this,local_d8,&local_74);
      }
    }
  }
  RVar33 = reason;
  if (cVar32 != '\0') {
    bVar7 = (pFVar17->field_0x179 & 8) != 0;
    if (bVar7) {
      cVar32 = '\0';
    }
    RVar33 = AfterLoopBodyRejit;
    if (!bVar7) {
      RVar33 = reason;
    }
  }
  if (cVar32 == '\0') {
    if (RVar33 != None) {
      if ((local_60->type == SharedForLoopTop) &&
         (bVar7 = IR::IsTypeCheckBailOutKind(local_60->bailOutKind), pFVar17 = local_48, bVar7)) {
        puVar1 = &(local_40->bits).field_0x4;
        *puVar1 = *puVar1 | 0x40;
      }
      pSVar23 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar17);
      Js::ScriptContext::LogRejit(pSVar23,local_48,RVar33);
      local_48->field_0x179 = local_48->field_0x179 & 0xf7;
      pSVar23 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_48);
      GenerateFunction(pSVar23->nativeCodeGen,local_48,local_68);
      EVar8 = Js::FunctionBody::GetExecutionMode(local_48);
      if (EVar8 != FullJit) {
        Js::FunctionBody::TraceExecutionMode(local_48,"Rejit (before)");
        Js::FunctionBody::TransitionToFullJitExecutionMode(local_48);
        Js::FunctionBody::TraceExecutionMode(local_48,"Rejit");
      }
      uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_48);
      pFVar26 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar26 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar18 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar7) {
LAB_003fcf16:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar18 = 0;
        pFVar26 = (local_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ReJITPhase,uVar13,pFVar26->functionId);
      pFVar17 = local_48;
      if (bVar7) {
        iVar14 = (*(local_48->super_ParseableFunctionInfo).super_FunctionProxy.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [7])(local_48);
        uVar6 = local_58;
        pcVar27 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)pFVar17,(wchar (*) [42])local_d8);
        Output::Print(L"Rejit: function: %s (%s), bailOutCount: %hu",
                      CONCAT44(extraout_var_02,iVar14),pcVar27,(ulong)local_60->bailOutCount);
        Output::Print(L" callCount: %u",(ulong)local_49);
        pcVar24 = GetRejitReasonName(RVar33);
        Output::Print(L" reason: %S",pcVar24);
        if ((BailOutKind)uVar6 != BailOutInvalid) {
          pcVar24 = GetBailOutKindName((BailOutKind)uVar6);
          Output::Print(L" (%S)",pcVar24);
        }
        Output::Print(L"\n");
        Output::Flush();
      }
    }
  }
  else {
    pFVar19 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(pFVar17);
    entryPoint = Js::FunctionProxy::GetDirectEntryPoint
                           ((FunctionProxy *)pFVar17,(ProxyEntryPointInfo *)pFVar19);
    Js::ScriptFunction::UpdateThunkEntryPoint(local_68,pFVar19,entryPoint);
  }
  stack0xffffffffffffff80->firstInterpreterFrameReturnAddress = (void *)0x0;
  return;
}

Assistant:

void BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction * function, Js::ScriptFunction * innerMostInlinee,
    BailOutRecord const * bailOutRecord, IR::BailOutKind bailOutKind, uint32 actualBailOutOffset, Js::ImplicitCallFlags savedImplicitCallFlags, void * returnAddress)
{
    if (bailOutKind == IR::BailOnSimpleJitToFullJitLoopBody ||
        bailOutKind == IR::BailOutForGeneratorYield ||
        bailOutKind == IR::LazyBailOut)
    {
        return;
    }

    Js::FunctionBody * executeFunction = function->GetFunctionBody();

    if (PHASE_OFF(Js::ReJITPhase, executeFunction))
    {
        return;
    }

    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(executeFunction->GetScriptContext(), returnAddress);

    BailOutRecord * bailOutRecordNotConst = (BailOutRecord *)(void *)bailOutRecord;
    bailOutRecordNotConst->bailOutCount++;

    Js::FunctionEntryPointInfo *entryPointInfo = bailOutRecord->GetFunctionEntryPointInfo();

#if DBG
    // BailOutRecord is not recycler-allocated, so make sure something the recycler can see was keeping the entry point info alive.
    // We expect the entry point to be kept alive as follows:
    // 1. The function's current type might still have the same entry point info as when we entered the function (easy case)
    // 2. The function might have moved to a successor path type, which still keeps the previous type and its entry point info alive
    // 3. The entry point info might be held by the ThreadContext (QueueFreeOldEntryPointInfoIfInScript):
    //   a. If the entry point info was replaced on the type that used to hold it (ScriptFunction::ChangeEntryPoint)
    //   b. If the function's last-added property was deleted and it moved to a previous type (ScriptFunction::ReplaceTypeWithPredecessorType)
    //   c. If the function's path type got replaced with a dictionary, then all previous entry point infos in that path are queued on the ThreadContext (ScriptFunction::PrepareForConversionToNonPathType)
    bool foundEntryPoint = false;
    executeFunction->MapEntryPointsUntil([&](int index, Js::FunctionEntryPointInfo* info)
    {
        foundEntryPoint = info == entryPointInfo;
        return foundEntryPoint;
    });
    foundEntryPoint = foundEntryPoint || function->GetScriptContext()->GetThreadContext()->IsOldEntryPointInfo(entryPointInfo);
    Assert(foundEntryPoint);
#endif

    uint8 callsCount = entryPointInfo->callsCount > 255 ? 255 : static_cast<uint8>(entryPointInfo->callsCount);
    RejitReason rejitReason = RejitReason::None;
    bool reThunk = false;

    callsCount = callsCount <= Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ? 0 : callsCount - Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ;

    CheckPreemptiveRejit(executeFunction, bailOutKind, bailOutRecordNotConst, callsCount, -1);

    entryPointInfo->callsCount = callsCount;

    Assert(bailOutKind != IR::BailOutInvalid);

    Js::DynamicProfileInfo * profileInfo = executeFunction->HasDynamicProfileInfo() ? executeFunction->GetAnyDynamicProfileInfo() : nullptr;
    if ((profileInfo && callsCount == 0) ||
        PHASE_FORCE(Js::ReJITPhase, executeFunction))
    {
        if ((bailOutKind & (IR::BailOutOnResultConditions | IR::BailOutOnDivSrcConditions)) || bailOutKind == IR::BailOutIntOnly || bailOutKind == IR::BailOnIntMin || bailOutKind == IR::BailOnDivResultNotInt)
        {
            // Note WRT BailOnIntMin: it wouldn't make sense to re-jit without changing anything here, as interpreter will not change the (int) type,
            // so the options are: (1) rejit with disabling int type spec, (2) don't rejit, always bailout.
            // It seems to be better to rejit.
            if (bailOutKind & IR::BailOutOnMulOverflow)
            {
                if (profileInfo->IsAggressiveMulIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveMulIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveMulIntTypeSpecDisabled;
                }
            }
            else if ((bailOutKind & (IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)) || bailOutKind == IR::BailOnDivResultNotInt)
            {
                if (profileInfo->IsDivIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableDivIntTypeSpec(false);
                    rejitReason = RejitReason::DivIntTypeSpecDisabled;
                }
            }
            else
            {
                if (profileInfo->IsAggressiveIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveIntTypeSpecDisabled;
                }
            }
        }
        else if (bailOutKind & IR::BailOutForDebuggerBits)
        {
            // Do not rejit, do not rethunk, just ignore the bailout.
        }
        else switch(bailOutKind)
        {
            case IR::BailOutOnNotPrimitive:
                if (profileInfo->IsLossyIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLossyIntTypeSpec();
                    rejitReason = RejitReason::LossyIntTypeSpecDisabled;
                }
                break;
            case IR::BailOutOnMemOpError:
                if (profileInfo->IsMemOpDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableMemOp();
                    rejitReason = RejitReason::MemOpDisabled;
                }
                break;

            case IR::BailOutPrimitiveButString:
            case IR::BailOutNumberOnly:
                if (profileInfo->IsFloatTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloatTypeSpec();
                    rejitReason = RejitReason::FloatTypeSpecDisabled;
                }
                break;

            case IR::BailOutOnImplicitCalls:
            case IR::BailOutOnImplicitCallsPreOp:
                // Check if the implicit call flags in the profile have changed since we last JITed this
                // function body. If so, and they indicate an implicit call of some sort occurred
                // then we need to reJIT.
                if ((executeFunction->GetSavedImplicitCallsFlags() & savedImplicitCallFlags) == Js::ImplicitCall_None)
                {
                    profileInfo->RecordImplicitCallFlags(savedImplicitCallFlags);
                    profileInfo->DisableLoopImplicitCallInfo();
                    rejitReason = RejitReason::ImplicitCallFlagsChanged;
                }
                else
                {
                    reThunk = true;
                }
                break;

            case IR::BailOnModByPowerOf2:
                rejitReason = RejitReason::ModByPowerOf2;
                break;

            case IR::BailOutOnNotArray:
                if(profileInfo->IsArrayCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayCheckHoist(false);
                    rejitReason = RejitReason::ArrayCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnNotNativeArray:

                // REVIEW: We have an issue with array profile info.  The info on the type of array we have won't
                //         get fixed by rejitting.  For now, just give up after 50 rejits.
                if (profileInfo->GetRejitCount() >= 50)
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = RejitReason::ExpectingNativeArray;
                }
                break;

            case IR::BailOutConvertedNativeArray:
                rejitReason = RejitReason::ConvertedNativeArray;
                break;

            case IR::BailOutConventionalTypedArrayAccessOnly:
                if(profileInfo->IsTypedArrayTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTypedArrayTypeSpec(false);
                    rejitReason = RejitReason::TypedArrayTypeSpecDisabled;
                }
                break;

            case IR::BailOutConventionalNativeArrayAccessOnly:
                rejitReason = RejitReason::ExpectingConventionalNativeArrayAccess;
                break;

            case IR::BailOutOnMissingValue:
                if(profileInfo->IsArrayMissingValueCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayMissingValueCheckHoist(false);
                    rejitReason = RejitReason::ArrayMissingValueCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnArrayAccessHelperCall:
                // This is a pre-op bailout, so the interpreter will update the profile data for this byte-code instruction to
                // prevent excessive bailouts here in the future
                rejitReason = RejitReason::ArrayAccessNeededHelperCall;
                break;

            case IR::BailOutOnInvalidatedArrayHeadSegment:
                if(profileInfo->IsJsArraySegmentHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableJsArraySegmentHoist(false);
                    rejitReason = RejitReason::JsArraySegmentHoistDisabled;
                }
                break;

            case IR::BailOutOnIrregularLength:
                if(profileInfo->IsLdLenIntSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLdLenIntSpec();
                    rejitReason = RejitReason::LdLenIntSpecDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedBoundCheck:
                if(profileInfo->IsBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableBoundCheckHoist(false);
                    rejitReason = RejitReason::BoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
                if(profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLoopCountBasedBoundCheckHoist(false);
                    rejitReason = RejitReason::LoopCountBasedBoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutExpectingInteger:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingInteger;
                }
                break;

            case IR::BailOutExpectingString:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingString;
                }
                break;

            case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
                rejitReason = RejitReason::FailedPolymorphicInlineeTypeCheck;
                break;

            case IR::BailOnStackArgsOutOfActualsRange:
                if (profileInfo->IsStackArgOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableStackArgOpt();
                    rejitReason = RejitReason::DisableStackArgOpt;
                }
                break;
            case IR::BailOutOnPolymorphicInlineFunction:
            case IR::BailOutFailedInlineTypeCheck:
            case IR::BailOutOnInlineFunction:
                // Check if the inliner state has changed since we last JITed this function body. If so
                // then we need to reJIT.
                if (innerMostInlinee)
                {
                    // There is no way now to check if the inlinee version has changed. Just rejit.
                    // This should be changed to getting the inliner version corresponding to inlinee.
                    rejitReason = RejitReason::InlineeChanged;
                }
                else
                {
                    if (executeFunction->GetSavedInlinerVersion() == profileInfo->GetInlinerVersion())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = RejitReason::InlineeChanged;
                    }
                }
                break;

            case IR::BailOutOnNoProfile:
                if (profileInfo->IsNoProfileBailoutsDisabled())
                {
                    reThunk = true;
                }
                else if (executeFunction->IncrementBailOnMisingProfileRejitCount() >  (uint)CONFIG_FLAG(BailOnNoProfileRejitLimit))
                {
                    profileInfo->DisableNoProfileBailouts();
                    rejitReason = RejitReason::NoProfile;
                }
                else
                {
                    executeFunction->ResetBailOnMisingProfileCount();
                    rejitReason = RejitReason::NoProfile;
                }
                break;

            case IR::BailOutCheckThis:
                // Presumably we've started passing a different "this" pointer to callees.
                if (profileInfo->IsCheckThisDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableCheckThis();
                    rejitReason = RejitReason::CheckThisDisabled;
                }
                break;

            case IR::BailOutOnTaggedValue:
                if (profileInfo->IsTagCheckDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTagCheck();
                    rejitReason = RejitReason::FailedTagCheck;
                }
                break;

            case IR::BailOutFailedTypeCheck:
            case IR::BailOutFailedFixedFieldTypeCheck:
            {
                // An inline cache must have gone from monomorphic to polymorphic.
                // This is already noted in the profile data, so optimization of the given ld/st will
                // be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.
                if (innerMostInlinee)
                {
                    rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ? RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                }
                else
                {
                    uint32 state;
                    state = profileInfo->GetPolymorphicCacheState();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (PHASE_TRACE(Js::ObjTypeSpecPhase, executeFunction))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        Output::Print(
                            _u("Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n"),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), executeFunction->GetSavedPolymorphicCacheState(), state);
                        Output::Flush();
                    }
#endif
                    if (state <= executeFunction->GetSavedPolymorphicCacheState())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ?
                            RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                    }
                }
                break;
            }

            case IR::BailOutFailedEquivalentTypeCheck:
            case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
                if (profileInfo->IsEquivalentObjTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = bailOutKind == IR::BailOutFailedEquivalentTypeCheck ?
                        RejitReason::FailedEquivalentTypeCheck : RejitReason::FailedEquivalentFixedFieldTypeCheck;
                }
                break;

            case IR::BailOutFailedFixedFieldCheck:
                rejitReason = RejitReason::FailedFixedFieldCheck;
                break;

            case IR::BailOutFailedCtorGuardCheck:
                // (ObjTypeSpec): Consider scheduling re-JIT right after the first bailout.  We will never successfully execute the
                // function from which we just bailed out, unless we take a different code path through it.

                // A constructor cache guard may be invalidated for one of two reasons:
                // a) the constructor's prototype property has changed, or
                // b) one of the properties protected by the guard (this constructor cache served as) has changed in some way (e.g. became read-only).
                // In the former case, the cache itself will be marked as polymorphic and on re-JIT we won't do the optimization.
                // In the latter case, the inline cache for the offending property will be cleared and on re-JIT the guard will not be enlisted
                // to protect that property operation.
                rejitReason = RejitReason::CtorGuardInvalidated;
                break;

            case IR::BailOutOnFloor:
            {
                if (profileInfo->IsFloorInliningDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloorInlining();
                    rejitReason = RejitReason::FloorInliningDisabled;
                }
                break;
            }
            case IR::BailOutOnPowIntIntOverflow:
            {
                if (profileInfo->IsPowIntIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisablePowIntIntTypeSpec();
                    rejitReason = RejitReason::PowIntIntTypeSpecDisabled;
                }
                break;
            }
            case IR::BailOutOnEarlyExit:
            {
                if (profileInfo->IsOptimizeTryFinallyDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableOptimizeTryFinally();
                    rejitReason = RejitReason::OptimizeTryFinallyDisabled;
                }
                break;
            }
        }

        Assert(!(rejitReason != RejitReason::None && reThunk));
    }

    if(PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
    {
        rejitReason = RejitReason::Forced;
    }

    if (!reThunk && rejitReason != RejitReason::None)
    {
        // REVIEW: Temporary fix for RS1.  Disable Rejiting if it looks like it is not fixing the problem.
        //         For RS2, turn the rejitCount check into an assert and let's fix all these issues.
        if (profileInfo->GetRejitCount() >= 100 ||
            (profileInfo->GetBailOutOffsetForLastRejit() == actualBailOutOffset && function->IsNewEntryPointAvailable()))
        {
#ifdef REJIT_STATS
            Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
            if (scriptContext->rejitReasonCountsCap != nullptr)
            {
                scriptContext->rejitReasonCountsCap[static_cast<byte>(rejitReason)]++;
            }
#endif
            reThunk = true;
            rejitReason = RejitReason::None;
        }
        else
        {
            profileInfo->IncRejitCount();
            profileInfo->SetBailOutOffsetForLastRejit(actualBailOutOffset);
        }
    }

    REJIT_KIND_TESTTRACE(bailOutKind, _u("Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"),
        function->GetFunctionBody()->GetDisplayName(), ::GetBailOutKindName(bailOutKind), bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk ? trueString : falseString);

    JS_ETW(EventWriteJSCRIPT_BACKEND_BAILOUT(function->GetFunctionBody()->GetLocalFunctionId(),
        function->GetFunctionBody()->GetSourceContextId(), function->GetFunctionBody()->GetDisplayName(), bailOutKind, bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk));

#ifdef REJIT_STATS
    executeFunction->GetScriptContext()->LogBailout(executeFunction, bailOutKind);
    if (bailOutRecord->bailOutCount > 500)
    {
        Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
        auto bailoutReasonCountsCap = scriptContext->bailoutReasonCountsCap;
        if (bailoutReasonCountsCap != nullptr)
        {
            if (!bailoutReasonCountsCap->ContainsKey(bailOutKind))
            {
                bailoutReasonCountsCap->Item(bailOutKind, 1);
            }
            else
            {
                uint val = bailoutReasonCountsCap->Item(bailOutKind);
                ++val;
                bailoutReasonCountsCap->Item(bailOutKind, val);
            }
        }
    }
#endif

    if (reThunk && executeFunction->DontRethunkAfterBailout())
    {
        // This function is marked for rethunking, but the last ReJIT we've done was for a JIT loop body
        // So the latest rejitted version of this function may not have the right optimization disabled.
        // Rejit just to be safe.
        reThunk = false;
        rejitReason = RejitReason::AfterLoopBodyRejit;
    }
    if (reThunk)
    {
        Js::FunctionEntryPointInfo *const defaultEntryPointInfo = executeFunction->GetDefaultFunctionEntryPointInfo();
        function->UpdateThunkEntryPoint(defaultEntryPointInfo, executeFunction->GetDirectEntryPoint(defaultEntryPointInfo));
    }
    else if (rejitReason != RejitReason::None)
    {
        if (bailOutRecord->IsForLoopTop() && IR::IsTypeCheckBailOutKind(bailOutRecord->bailOutKind))
        {
            // Disable FieldPRE if we're triggering a type check rejit due to a bailout at the loop top.
            // Most likely this was caused by a CheckFixedFld that was hoisted from a branch block where
            // only certain types flowed, to the loop top, where more types (different or non-equivalent)
            // were flowing in.
            profileInfo->DisableFieldPRE();
        }
#ifdef REJIT_STATS
        executeFunction->GetScriptContext()->LogRejit(executeFunction, rejitReason);
#endif
        executeFunction->ClearDontRethunkAfterBailout();

        GenerateFunction(executeFunction->GetScriptContext()->GetNativeCodeGenerator(), executeFunction, function);

        if(executeFunction->GetExecutionMode() != ExecutionMode::FullJit)
        {
            // With expiry, it's possible that the execution mode is currently interpreter or simple JIT. Transition to full JIT
            // after successfully scheduling the rejit work item (in case of OOM).
            executeFunction->TraceExecutionMode("Rejit (before)");
            executeFunction->TransitionToFullJitExecutionMode();
            executeFunction->TraceExecutionMode("Rejit");
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(PHASE_TRACE(Js::ReJITPhase, executeFunction))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("Rejit: function: %s (%s), bailOutCount: %hu"),
                executeFunction->GetDisplayName(),
                executeFunction->GetDebugNumberSet(debugStringBuffer),
                bailOutRecord->bailOutCount);

            Output::Print(_u(" callCount: %u"), callsCount);
            Output::Print(_u(" reason: %S"), GetRejitReasonName(rejitReason));
            if(bailOutKind != IR::BailOutInvalid)
            {
                Output::Print(_u(" (%S)"), ::GetBailOutKindName(bailOutKind));
            }
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }
}